

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_max_message_size(ATTACH_HANDLE attach,uint64_t max_message_size_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE max_message_size_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  uint64_t max_message_size_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x134c;
  }
  else {
    item_value = amqpvalue_create_ulong(max_message_size_value);
    if (item_value == (AMQP_VALUE)0x0) {
      attach_instance._4_4_ = 0x1354;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,10,item_value);
      if (iVar1 == 0) {
        attach_instance._4_4_ = 0;
      }
      else {
        attach_instance._4_4_ = 0x135a;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_set_max_message_size(ATTACH_HANDLE attach, uint64_t max_message_size_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE max_message_size_amqp_value = amqpvalue_create_ulong(max_message_size_value);
        if (max_message_size_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 10, max_message_size_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(max_message_size_amqp_value);
        }
    }

    return result;
}